

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model.c
# Opt level: O0

void update_piecewise_linear_residual
               (aom_noise_strength_solver_t *solver,aom_noise_strength_lut_t *lut,double *residual,
               int start,int end)

{
  int iVar1;
  int iVar2;
  int in_ECX;
  long in_RDX;
  long *in_RSI;
  aom_noise_strength_solver_t *in_RDI;
  int in_R8D;
  double dVar3;
  double estimate_y;
  double a;
  double y;
  double x;
  int j;
  double r;
  int upper;
  int lower;
  int i;
  double dx;
  int local_80;
  int in_stack_ffffffffffffff88;
  int iVar4;
  int iVar5;
  int local_44;
  double local_40;
  int local_2c;
  
  iVar1 = in_RDI->num_bins;
  local_2c = in_ECX;
  if (in_ECX < 2) {
    in_ECX = 1;
    local_2c = in_ECX;
  }
  while( true ) {
    iVar4 = in_R8D;
    if ((int)in_RSI[1] + -1 <= in_R8D) {
      iVar4 = (int)in_RSI[1] + -1;
    }
    if (iVar4 <= local_2c) break;
    iVar5 = local_2c;
    dVar3 = noise_strength_solver_get_bin_index
                      ((aom_noise_strength_solver_t *)CONCAT44(in_ECX,local_2c),
                       (double)CONCAT44(iVar4,in_stack_ffffffffffffff88));
    dVar3 = floor(dVar3);
    if ((int)dVar3 < 0) {
      local_44 = 0;
    }
    else {
      dVar3 = noise_strength_solver_get_bin_index
                        ((aom_noise_strength_solver_t *)CONCAT44(in_ECX,iVar5),
                         (double)CONCAT44(iVar4,in_stack_ffffffffffffff88));
      dVar3 = floor(dVar3);
      local_44 = (int)dVar3;
    }
    iVar2 = in_RDI->num_bins;
    in_stack_ffffffffffffff88 = local_44;
    dVar3 = noise_strength_solver_get_bin_index
                      ((aom_noise_strength_solver_t *)CONCAT44(in_ECX,iVar5),
                       (double)CONCAT44(iVar4,local_44));
    dVar3 = ceil(dVar3);
    if (iVar2 + -1 < (int)dVar3) {
      local_80 = in_RDI->num_bins + -1;
    }
    else {
      dVar3 = noise_strength_solver_get_bin_index
                        ((aom_noise_strength_solver_t *)CONCAT44(in_ECX,iVar5),
                         (double)CONCAT44(iVar4,in_stack_ffffffffffffff88));
      dVar3 = ceil(dVar3);
      local_80 = (int)dVar3;
    }
    local_40 = 0.0;
    for (; local_44 <= local_80; local_44 = local_44 + 1) {
      dVar3 = aom_noise_strength_solver_get_center(in_RDI,local_44);
      if ((*(double *)(*in_RSI + (long)(local_2c + -1) * 0x10) <= dVar3) &&
         (dVar3 < *(double *)(*in_RSI + (long)(local_2c + 1) * 0x10))) {
        dVar3 = (dVar3 - *(double *)(*in_RSI + (long)(local_2c + -1) * 0x10)) /
                (*(double *)(*in_RSI + (long)(local_2c + 1) * 0x10) -
                *(double *)(*in_RSI + (long)(local_2c + -1) * 0x10));
        local_40 = ABS((in_RDI->eqns).x[local_44] -
                       (*(double *)(*in_RSI + (long)(local_2c + -1) * 0x10 + 8) * (1.0 - dVar3) +
                       *(double *)(*in_RSI + (long)(local_2c + 1) * 0x10 + 8) * dVar3)) + local_40;
      }
    }
    *(double *)(in_RDX + (long)local_2c * 8) = local_40 * (255.0 / (double)iVar1);
    local_2c = local_2c + 1;
  }
  return;
}

Assistant:

static void update_piecewise_linear_residual(
    const aom_noise_strength_solver_t *solver,
    const aom_noise_strength_lut_t *lut, double *residual, int start, int end) {
  const double dx = 255. / solver->num_bins;
  for (int i = AOMMAX(start, 1); i < AOMMIN(end, lut->num_points - 1); ++i) {
    const int lower = AOMMAX(0, (int)floor(noise_strength_solver_get_bin_index(
                                    solver, lut->points[i - 1][0])));
    const int upper = AOMMIN(solver->num_bins - 1,
                             (int)ceil(noise_strength_solver_get_bin_index(
                                 solver, lut->points[i + 1][0])));
    double r = 0;
    for (int j = lower; j <= upper; ++j) {
      const double x = aom_noise_strength_solver_get_center(solver, j);
      if (x < lut->points[i - 1][0]) continue;
      if (x >= lut->points[i + 1][0]) continue;
      const double y = solver->eqns.x[j];
      const double a = (x - lut->points[i - 1][0]) /
                       (lut->points[i + 1][0] - lut->points[i - 1][0]);
      const double estimate_y =
          lut->points[i - 1][1] * (1.0 - a) + lut->points[i + 1][1] * a;
      r += fabs(y - estimate_y);
    }
    residual[i] = r * dx;
  }
}